

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

uchar * Cnf_DataDeriveLitPolarities(Cnf_Dat_t *p)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  void *__ptr_00;
  uchar *puVar7;
  int **ppiVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  
  iVar4 = p->pMan->vObjs->nSize;
  __ptr = calloc((long)iVar4,4);
  __ptr_00 = calloc((long)iVar4,4);
  puVar7 = (uchar *)calloc((long)p->nClauses,1);
  for (lVar15 = 0; lVar15 < iVar4; lVar15 = lVar15 + 1) {
    if ((long)p->pObj2Count[lVar15] != 0) {
      lVar14 = (long)p->pObj2Clause[lVar15];
      lVar9 = p->pObj2Count[lVar15] + lVar14;
      lVar3 = lVar14;
      while (lVar11 = lVar3, lVar3 = lVar14, lVar11 < lVar9) {
        ppiVar8 = p->pClauses;
        piVar13 = ppiVar8[lVar11];
        while (piVar13 = piVar13 + 1, lVar3 = lVar11 + 1, piVar13 < ppiVar8[lVar11 + 1]) {
          iVar4 = Abc_LitIsCompl(*ppiVar8[lVar11]);
          iVar5 = Abc_LitIsCompl(*piVar13);
          uVar6 = Abc_Lit2Var(*piVar13);
          pvVar10 = __ptr;
          if (iVar4 == 0) {
            pvVar10 = __ptr_00;
          }
          puVar1 = (uint *)((long)pvVar10 + (ulong)uVar6 * 4);
          *puVar1 = *puVar1 | 2U - iVar5;
          ppiVar8 = p->pClauses;
        }
      }
      while (lVar11 = lVar3, lVar11 < lVar9) {
        ppiVar8 = p->pClauses;
        piVar12 = ppiVar8[lVar11] + 1;
        piVar13 = piVar12;
        for (; lVar3 = lVar11 + 1, piVar12 < ppiVar8[lVar11 + 1]; piVar12 = piVar12 + 1) {
          iVar4 = Abc_LitIsCompl(*ppiVar8[lVar11]);
          bVar2 = puVar7[lVar11];
          uVar6 = Abc_Lit2Var(*piVar12);
          ppiVar8 = p->pClauses;
          pvVar10 = __ptr;
          if (iVar4 == 0) {
            pvVar10 = __ptr_00;
          }
          puVar7[lVar11] =
               (byte)(*(int *)((long)pvVar10 + (ulong)uVar6 * 4) <<
                     ((char)((uint)((int)piVar13 - *(int *)(ppiVar8 + lVar11)) >> 1) - 2U & 0x1f)) |
               bVar2;
          piVar13 = piVar13 + 1;
        }
      }
      while (lVar14 < lVar9) {
        ppiVar8 = p->pClauses;
        piVar13 = ppiVar8[lVar14];
        lVar14 = lVar14 + 1;
        while (piVar13 = piVar13 + 1, piVar13 < ppiVar8[lVar14]) {
          uVar6 = Abc_Lit2Var(*piVar13);
          *(undefined4 *)((long)__ptr_00 + (ulong)uVar6 * 4) = 0;
          uVar6 = Abc_Lit2Var(*piVar13);
          *(undefined4 *)((long)__ptr + (ulong)uVar6 * 4) = 0;
          ppiVar8 = p->pClauses;
        }
      }
      iVar4 = p->pMan->vObjs->nSize;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return puVar7;
}

Assistant:

unsigned char * Cnf_DataDeriveLitPolarities( Cnf_Dat_t * p )
{
    int i, c, iClaBeg, iClaEnd, * pLit;
    unsigned * pPols0 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned * pPols1 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned char * pPres = ABC_CALLOC( unsigned char, p->nClauses );
    for ( i = 0; i < Aig_ManObjNumMax(p->pMan); i++ )
    {
        if ( p->pObj2Count[i] == 0 )
            continue;
        iClaBeg = p->pObj2Clause[i];
        iClaEnd = p->pObj2Clause[i] + p->pObj2Count[i];
        // go through the negative polarity clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPols0[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
                else
                    pPols1[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
        // record these clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols0[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
                else
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols1[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
        // clean negative polarity
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                pPols0[Abc_Lit2Var(*pLit)] = pPols1[Abc_Lit2Var(*pLit)] = 0;
    }
    ABC_FREE( pPols0 );
    ABC_FREE( pPols1 );
/*
//    for ( c = 0; c < p->nClauses; c++ )
    for ( c = 0; c < 100; c++ )
    {
        printf( "Clause %6d : ", c );
        for ( i = 0; i < 4; i++ )
            printf( "%d ", ((unsigned)pPres[c] >> (2*i)) & 3 );
        printf( "  " );
        for ( pLit = p->pClauses[c]; pLit < p->pClauses[c+1]; pLit++ )
            printf( "%6d ", *pLit );
        printf( "\n" );
    }
*/
    return pPres;
}